

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlat_parser.c
# Opt level: O0

void XlatParse(void *yyp,int yymajor,FParseToken yyminor,FParseContext *context)

{
  bool bVar1;
  FParseToken yyMinor;
  FParseToken yyminor_00;
  yyParser *pyVar2;
  int iVar3;
  uint yyNewState;
  char local_129;
  yyStackEntry *pyStack_128;
  char cDiv;
  yyStackEntry *i;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  yyParser *local_80;
  yyParser *yypParser;
  int yyendofinput;
  uint yyact;
  YYMINORTYPE yyminorunion;
  FParseContext *context_local;
  void *pvStack_10;
  int yymajor_local;
  void *yyp_local;
  
  local_80 = (yyParser *)yyp;
  yyminorunion._72_8_ = context;
  context_local._4_4_ = yymajor;
  pvStack_10 = yyp;
  if (*yyp == 0) {
    __assert_fail("yypParser->yytos!=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O0/src/xlat_parser.c"
                  ,0x740,"void XlatParse(void *, int, FParseToken, FParseContext *)");
  }
  yypParser._0_4_ = (uint)(yymajor == 0);
  *(FParseContext **)((long)yyp + 0x10) = context;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sInput \'%s\'\n",yyTracePrompt,yyTokenName[yymajor]);
    fflush((FILE *)yyTraceFILE);
  }
  do {
    yyNewState = yy_find_shift_action(local_80,(uchar)context_local._4_4_);
    iVar3 = context_local._4_4_;
    pyVar2 = local_80;
    yypParser._4_4_ = yyNewState;
    if (yyNewState < 0xe9) {
      memcpy(&local_d0,&yyminor,0x50);
      yyMinor._8_8_ = uStack_c8;
      yyMinor.fval = (double)local_d0;
      yyMinor._16_8_ = local_c0;
      yyMinor._24_8_ = uStack_b8;
      yyMinor._32_8_ = local_b0;
      yyMinor._40_8_ = uStack_a8;
      yyMinor._48_8_ = local_a0;
      yyMinor._56_8_ = uStack_98;
      yyMinor._64_8_ = local_90;
      yyMinor._72_8_ = uStack_88;
      yy_shift(pyVar2,yyNewState,iVar3,yyMinor);
      local_80->yyerrcnt = local_80->yyerrcnt + -1;
      context_local._4_4_ = 0x47;
    }
    else if (yyNewState < 0x137) {
      yy_reduce(local_80,yyNewState - 0xe9);
    }
    else {
      if (yyNewState != 0x137) {
        __assert_fail("yyact == YY_ERROR_ACTION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O0/src/xlat_parser.c"
                      ,0x758,"void XlatParse(void *, int, FParseToken, FParseContext *)");
      }
      memcpy(&yyendofinput,&yyminor,0x50);
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
        fflush((FILE *)yyTraceFILE);
      }
      iVar3 = context_local._4_4_;
      pyVar2 = local_80;
      if (local_80->yyerrcnt < 1) {
        memcpy(&i,&yyminor,0x50);
        yyminor_00._8_8_ = uStack_118;
        yyminor_00.symval = (FParseSymbol *)i;
        yyminor_00._16_8_ = local_110;
        yyminor_00._24_8_ = uStack_108;
        yyminor_00._32_8_ = local_100;
        yyminor_00._40_8_ = uStack_f8;
        yyminor_00._48_8_ = local_f0;
        yyminor_00._56_8_ = uStack_e8;
        yyminor_00._64_8_ = local_e0;
        yyminor_00._72_8_ = uStack_d8;
        yy_syntax_error(pyVar2,iVar3,yyminor_00);
      }
      local_80->yyerrcnt = 3;
      yy_destructor(local_80,(uchar)context_local._4_4_,(YYMINORTYPE *)&yyendofinput);
      if ((uint)yypParser != 0) {
        yy_parse_failed(local_80);
        local_80->yyerrcnt = -1;
      }
      context_local._4_4_ = 0x47;
    }
    bVar1 = false;
    if (context_local._4_4_ != 0x47) {
      bVar1 = local_80->yystack < local_80->yytos;
    }
  } while (bVar1);
  if (yyTraceFILE != (FILE *)0x0) {
    local_129 = '[';
    fprintf((FILE *)yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    pyStack_128 = local_80->yystack;
    while (pyStack_128 = pyStack_128 + 1, pyStack_128 <= local_80->yytos) {
      fprintf((FILE *)yyTraceFILE,"%c%s",(ulong)(uint)(int)local_129,yyTokenName[pyStack_128->major]
             );
      local_129 = ' ';
    }
    fprintf((FILE *)yyTraceFILE,"]\n");
    fflush((FILE *)yyTraceFILE);
  }
  return;
}

Assistant:

void XlatParse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  XlatParseTOKENTYPE yyminor       /* The value for the token */
  XlatParseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  unsigned int yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser;  /* The parser */

  yypParser = (yyParser*)yyp;
  assert( yypParser->yytos!=0 );
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif
  XlatParseARG_STORE;

#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sInput '%s'\n",yyTracePrompt,yyTokenName[yymajor]);
    fflush(yyTraceFILE);
  }
#endif

  do{
    yyact = yy_find_shift_action(yypParser,(YYCODETYPE)yymajor);
    if( yyact <= YY_MAX_SHIFTREDUCE ){
      yy_shift(yypParser,yyact,yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      yymajor = YYNOCODE;
    }else if( yyact <= YY_MAX_REDUCE ){
      yy_reduce(yypParser,yyact-YY_MIN_REDUCE);
    }else{
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifdef YYERRORSYMBOL
      int yymx;
#endif
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
        fflush(yyTraceFILE);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".  
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yytos->major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
          fflush(yyTraceFILE);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while( yypParser->yytos >= yypParser->yystack
            && yymx != YYERRORSYMBOL
            && (yyact = yy_find_reduce_action(
                        yypParser->yytos->stateno,
                        YYERRORSYMBOL)) >= YY_MIN_REDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yytos < yypParser->yystack || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
          yypParser->yyerrcnt = -1;
#endif
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      yymajor = YYNOCODE;
      
#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
        yypParser->yyerrcnt = -1;
#endif
      }
      yymajor = YYNOCODE;
#endif
    }
  }while( yymajor!=YYNOCODE && yypParser->yytos>yypParser->yystack );
#ifndef NDEBUG
  if( yyTraceFILE ){
    yyStackEntry *i;
    char cDiv = '[';
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=&yypParser->yystack[1]; i<=yypParser->yytos; i++){
      fprintf(yyTraceFILE,"%c%s", cDiv, yyTokenName[i->major]);
      cDiv = ' ';
    }
    fprintf(yyTraceFILE,"]\n");
    fflush(yyTraceFILE);
  }
#endif
  return;
}